

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

char * GetModuleOutputPath(Allocator *allocator,InplaceStr moduleName)

{
  Allocator *__src;
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  char *__dest_00;
  uint local_3c;
  uint i;
  char *pos;
  char *targetName;
  uint length;
  Allocator *allocator_local;
  InplaceStr moduleName_local;
  char *__dest;
  
  moduleName_local.begin = moduleName.end;
  allocator_local = (Allocator *)moduleName.begin;
  uVar1 = InplaceStr::length((InplaceStr *)&allocator_local);
  iVar2 = (*allocator->_vptr_Allocator[2])(allocator,(ulong)(uVar1 + 0xc));
  __dest = (char *)CONCAT44(extraout_var,iVar2);
  strcpy(__dest,"import_");
  sVar3 = strlen(__dest);
  __src = allocator_local;
  __dest_00 = __dest + sVar3;
  uVar1 = InplaceStr::length((InplaceStr *)&allocator_local);
  memcpy(__dest_00,__src,(ulong)uVar1);
  uVar1 = InplaceStr::length((InplaceStr *)&allocator_local);
  __dest_00[uVar1] = '\0';
  local_3c = 0;
  while( true ) {
    sVar3 = strlen(__dest);
    if (sVar3 <= local_3c) break;
    if ((__dest[local_3c] == '/') || (__dest[local_3c] == '.')) {
      __dest[local_3c] = '_';
    }
    local_3c = local_3c + 1;
  }
  strcpy(__dest_00 + uVar1,".cpp");
  return __dest;
}

Assistant:

const char* GetModuleOutputPath(Allocator *allocator, InplaceStr moduleName)
{
	unsigned length = unsigned(strlen("import_") + moduleName.length() + strlen(".cpp") + 1);
	char *targetName = (char*)allocator->alloc(length);

	char *pos = targetName;

	strcpy(pos, "import_");
	pos += strlen(pos);

	memcpy(pos, moduleName.begin, moduleName.length());
	pos += moduleName.length();

	*pos = 0;

	for(unsigned i = 0; i < strlen(targetName); i++)
	{
		if(targetName[i] == '/' || targetName[i] == '.')
			targetName[i] = '_';
	}

	strcpy(pos, ".cpp");

	return targetName;
}